

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O3

void __thiscall
SQCompilation::CheckerVisitor::speculateIfConditionHeuristics
          (CheckerVisitor *this,Expr *cond,VarScope *thenScope,VarScope *elseScope,
          unordered_set<const_SQCompilation::Expr_*,_std::hash<const_SQCompilation::Expr_*>,_std::equal_to<const_SQCompilation::Expr_*>,_std::allocator<const_SQCompilation::Expr_*>_>
          *visited,int32_t evalId,uint flags,bool inv)

{
  TreeOp TVar1;
  Expr *pEVar2;
  int *piVar3;
  int32_t iVar4;
  int iVar5;
  iterator iVar6;
  ulong uVar7;
  anon_struct_16_4_61b8340c_for__coordinates *paVar8;
  long lVar9;
  Id *pIVar10;
  Expr *pEVar11;
  VarScope *pVVar12;
  undefined4 extraout_var_00;
  uint pf;
  Expr *pEVar13;
  uint nf;
  TreeOp TVar14;
  Expr *pEVar15;
  Expr *pEVar16;
  VarScope *pVVar17;
  bool bVar18;
  anon_struct_16_4_61b8340c_for__coordinates *paVar19;
  bool bVar20;
  VarScope *local_70;
  Expr *local_68;
  int32_t local_5c;
  undefined8 local_58;
  LiteralExpr *typeLit;
  Expr *local_48;
  Expr *typeCheckee;
  Expr *nullcCheckee;
  undefined4 extraout_var;
  
  for (; cond != (Expr *)0x0; cond = (Expr *)cond[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
    if ((cond->super_Node)._op != TO_PAREN) goto LAB_0015523e;
  }
  cond = (Expr *)0x0;
LAB_0015523e:
  local_68 = cond;
  iVar6 = std::
          _Hashtable<const_SQCompilation::Expr_*,_const_SQCompilation::Expr_*,_std::allocator<const_SQCompilation::Expr_*>,_std::__detail::_Identity,_std::equal_to<const_SQCompilation::Expr_*>,_std::hash<const_SQCompilation::Expr_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&visited->_M_h,&local_68);
  if (iVar6.super__Node_iterator_base<const_SQCompilation::Expr_*,_false>._M_cur !=
      (__node_type *)0x0) {
    return;
  }
  local_5c = evalId;
  std::
  _Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<SQCompilation::Expr_const*&>
            ((_Hashtable<SQCompilation::Expr_const*,SQCompilation::Expr_const*,std::allocator<SQCompilation::Expr_const*>,std::__detail::_Identity,std::equal_to<SQCompilation::Expr_const*>,std::hash<SQCompilation::Expr_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_68);
  TVar14 = (local_68->super_Node)._op;
  pVVar12 = this->currentScope;
  pVVar17 = elseScope;
  if (TVar14 == TO_OROR) {
    local_58 = (Expr *)CONCAT44(local_58._4_4_,(int)CONCAT71((int7)((ulong)pVVar12 >> 8),1));
    TVar14 = TO_ANDAND;
LAB_001552e8:
    if (!inv) {
LAB_00155302:
      pVVar17 = thenScope;
      thenScope = elseScope;
    }
  }
  else {
    if (TVar14 == TO_NE) {
      TVar14 = TO_EQ;
      local_58 = (Expr *)((ulong)local_58._4_4_ << 0x20);
      goto LAB_001552e8;
    }
    if (TVar14 == TO_NOT) {
      bVar18 = !inv;
      pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      iVar5 = local_5c;
      goto LAB_001552bf;
    }
    local_58 = (Expr *)((ulong)local_58._4_4_ << 0x20);
    if (inv) goto LAB_00155302;
  }
  nullcCheckee = (Expr *)0x0;
  bVar18 = detectNullCPattern(this,TVar14,local_68,&nullcCheckee);
  iVar4 = local_5c;
  pEVar15 = local_68;
  if (bVar18) {
    if (((TVar14 & ~TO_WHILE) != TO_GE) && (TVar14 != TO_EQ)) {
      pVVar17 = thenScope;
    }
    if (pVVar17 == (VarScope *)0x0) goto LAB_0015542f;
    this->currentScope = pVVar17;
    pIVar10 = (Id *)nullcCheckee;
LAB_00155423:
    nf = 0;
    pf = 2;
    goto LAB_0015542a;
  }
  if (TVar14 != TO_NULLC) {
    if (thenScope != (VarScope *)0x0 && (TVar14 == TO_CALL && local_5c == -1)) {
      this->currentScope = thenScope;
      uVar7 = (ulong)local_68[1].super_Node._op;
      if (uVar7 != 0) {
        paVar8 = *(anon_struct_16_4_61b8340c_for__coordinates **)
                  &local_68[1].super_Node._coordinates.lineEnd;
        piVar3 = &paVar8->lineStart;
        paVar19 = paVar8;
        do {
          do {
            pEVar11 = *(Expr **)paVar8;
            TVar14 = (pEVar11->super_Node)._op;
            paVar8 = (anon_struct_16_4_61b8340c_for__coordinates *)(pEVar11 + 1);
          } while (TVar14 == TO_PAREN);
          if (TVar14 == TO_ID) {
            setValueFlags(this,pEVar11,0,2);
          }
          paVar8 = (anon_struct_16_4_61b8340c_for__coordinates *)&paVar19->lineEnd;
          paVar19 = paVar8;
        } while (paVar8 != (anon_struct_16_4_61b8340c_for__coordinates *)(piVar3 + uVar7 * 2));
      }
      pIVar10 = extractReceiver((Expr *)pEVar15[1].super_Node.super_ArenaObj._vptr_ArenaObj);
      if (pIVar10 != (Id *)0x0) goto LAB_00155423;
      goto LAB_0015542f;
    }
    if (TVar14 == TO_ID) {
      bVar20 = local_5c == -1;
      typeLit = (LiteralExpr *)CONCAT44(typeLit._4_4_,0xffffffff);
      local_58 = maybeEval(this,local_68,(int32_t *)&typeLit,false);
      iVar5 = (int)typeLit;
      bVar18 = (int)typeLit < iVar4;
      if (thenScope != (VarScope *)0x0 && (bVar18 || bVar20)) {
        this->currentScope = thenScope;
        setValueFlags(this,local_68,0,2);
        this->currentScope = pVVar12;
      }
      if (((flags & 1) != 0 && pVVar17 != (VarScope *)0x0) && (bVar18 || bVar20)) {
        this->currentScope = pVVar17;
        setValueFlags(this,local_68,2,0);
        this->currentScope = pVVar12;
      }
      if (local_58 == local_68) {
        return;
      }
      bVar18 = false;
      elseScope = pVVar17;
      pEVar11 = local_58;
LAB_001552bf:
      speculateIfConditionHeuristics(this,pEVar11,thenScope,elseScope,visited,iVar5,flags,bVar18);
      return;
    }
    if (TVar14 == TO_EQ) {
      for (pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
          pEVar11 != (Expr *)0x0;
          pEVar11 = (Expr *)pEVar11[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
        if ((pEVar11->super_Node)._op != TO_PAREN) goto LAB_001556cd;
      }
      pEVar11 = (Expr *)0x0;
LAB_001556cd:
      paVar8 = &local_68[1].super_Node._coordinates;
      do {
        pEVar2 = *(Expr **)paVar8;
        TVar1 = (pEVar2->super_Node)._op;
        paVar8 = (anon_struct_16_4_61b8340c_for__coordinates *)(pEVar2 + 1);
      } while (TVar1 == TO_PAREN);
      pEVar16 = (Expr *)0x0;
      if ((pEVar11->super_Node)._op == TO_LITERAL) {
        pEVar16 = pEVar11;
      }
      pEVar13 = (Expr *)0x0;
      if (TVar1 == TO_LITERAL) {
        pEVar13 = pEVar2;
      }
      if (pEVar16 != (Expr *)0x0) {
        pEVar13 = pEVar16;
      }
      if (pEVar13 == pEVar11) {
        pEVar11 = pEVar2;
      }
      if (pEVar13 == (Expr *)0x0) {
        return;
      }
      if (*(int *)&(pEVar13->super_Node).field_0x1c == 4) {
        flags = flags | 1;
        bVar18 = false;
        elseScope = thenScope;
        thenScope = pVVar17;
        iVar5 = local_5c;
        goto LAB_001552bf;
      }
      pIVar10 = extractReceiver(pEVar11);
      if ((thenScope != (VarScope *)0x0) && (pIVar10 != (Id *)0x0)) {
        this->currentScope = thenScope;
        setValueFlags(this,&pIVar10->super_Expr,0,2);
        this->currentScope = pVVar12;
        pEVar15 = local_68;
      }
LAB_001557cb:
      typeLit = (LiteralExpr *)0x0;
      typeCheckee = (Expr *)0x0;
      bVar18 = detectTypeOfPattern(this,pEVar15,&typeCheckee,&typeLit);
      pEVar11 = typeCheckee;
      if (bVar18) {
        pIVar10 = extractReceiver(typeCheckee);
        if (pIVar10 == (Id *)0x0) {
          return;
        }
        iVar5 = strcmp((typeLit->_v).s,"null");
        if (thenScope != (VarScope *)0x0) {
          this->currentScope = thenScope;
          setValueFlags(this,&pIVar10->super_Expr,(uint)((Id *)pEVar11 == pIVar10 && iVar5 == 0) * 2
                        ,(uint)(iVar5 != 0) * 2);
        }
        if (pVVar17 != (VarScope *)0x0) {
          pf = (uint)(iVar5 == 0) * 2;
          this->currentScope = pVVar17;
          nf = 0;
          goto LAB_0015542a;
        }
      }
      else {
        if (TVar14 == TO_ANDAND) {
          pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
          local_48 = *(Expr **)&local_68[1].super_Node._coordinates;
          if (pVVar17 == (VarScope *)0x0) {
            pVVar12 = (VarScope *)0x0;
            local_70 = (VarScope *)0x0;
          }
          else {
            iVar5 = VarScope::copy(pVVar17,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
            pVVar12 = (VarScope *)CONCAT44(extraout_var,iVar5);
            iVar5 = VarScope::copy(pVVar17,(EVP_PKEY_CTX *)this->arena,(EVP_PKEY_CTX *)0x0);
            local_70 = (VarScope *)CONCAT44(extraout_var_00,iVar5);
          }
          iVar4 = local_5c;
          bVar18 = SUB81(local_58,0);
          speculateIfConditionHeuristics
                    (this,pEVar11,thenScope,pVVar12,visited,local_5c,flags,bVar18);
          speculateIfConditionHeuristics
                    (this,local_48,thenScope,local_70,visited,iVar4,flags,bVar18);
          if (pVVar17 == (VarScope *)0x0) {
            return;
          }
          VarScope::intersectScopes(pVVar12,local_70);
          VarScope::copyFrom(pVVar17,pVVar12);
          VarScope::~VarScope(pVVar12);
          VarScope::~VarScope(local_70);
          return;
        }
        if (1 < TVar14 - TO_IN) {
          return;
        }
        pEVar11 = *(Expr **)&local_68[1].super_Node._coordinates;
        pIVar10 = extractReceiver((Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj);
        if ((thenScope != (VarScope *)0x0) && (pIVar10 != (Id *)0x0)) {
          this->currentScope = thenScope;
          setValueFlags(this,&pIVar10->super_Expr,0,2);
        }
        if (((TVar14 == TO_IN) && (pIVar10 = extractReceiver(pEVar11), thenScope != (VarScope *)0x0)
            ) && (pIVar10 != (Id *)0x0)) {
          this->currentScope = thenScope;
          goto LAB_00155423;
        }
      }
    }
    else if ((TVar14 == TO_GETSLOT) || (TVar14 == TO_GETFIELD)) {
      for (pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
          pEVar11 != (Expr *)0x0;
          pEVar11 = (Expr *)pEVar11[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
        if ((pEVar11->super_Node)._op != TO_PAREN) goto LAB_00155627;
      }
      pEVar11 = (Expr *)0x0;
LAB_00155627:
      pIVar10 = extractReceiver(pEVar11);
      if ((thenScope != (VarScope *)0x0) && (pIVar10 != (Id *)0x0)) {
        this->currentScope = thenScope;
        setValueFlags(this,&pIVar10->super_Expr,0,2);
      }
      if (TVar14 == TO_GETSLOT) {
        for (pIVar10 = *(Id **)&pEVar15[1].super_Node._coordinates.lineEnd; pIVar10 != (Id *)0x0;
            pIVar10 = (Id *)pIVar10->_id) {
          if ((pIVar10->super_Expr).super_Node._op != TO_PAREN) goto LAB_001556b9;
        }
        pIVar10 = (Id *)0x0;
LAB_001556b9:
        if (thenScope != (VarScope *)0x0) {
          this->currentScope = thenScope;
          goto LAB_00155423;
        }
      }
    }
    else {
      if (4 < TVar14 - TO_3CMP) goto LAB_001557cb;
      for (pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
          pEVar11 != (Expr *)0x0;
          pEVar11 = (Expr *)pEVar11[1].super_Node.super_ArenaObj._vptr_ArenaObj) {
        if ((pEVar11->super_Node)._op != TO_PAREN) goto LAB_00155738;
      }
      pEVar11 = (Expr *)0x0;
LAB_00155738:
      paVar8 = &local_68[1].super_Node._coordinates;
      do {
        pIVar10 = *(Id **)paVar8;
        TVar14 = (pIVar10->super_Expr).super_Node._op;
        paVar8 = (anon_struct_16_4_61b8340c_for__coordinates *)&pIVar10->_id;
      } while (TVar14 == TO_PAREN);
      pEVar15 = (Expr *)0x0;
      if ((pEVar11->super_Node)._op == TO_ID) {
        pEVar15 = pEVar11;
      }
      if (thenScope == (VarScope *)0x0) {
        return;
      }
      this->currentScope = thenScope;
      if (pEVar15 != (Expr *)0x0) {
        setValueFlags(this,pEVar15,0,2);
      }
      if (TVar14 == TO_ID) goto LAB_00155423;
    }
    goto LAB_0015542f;
  }
  for (pEVar11 = (Expr *)local_68[1].super_Node.super_ArenaObj._vptr_ArenaObj;
      pEVar11 != (Expr *)0x0; pEVar11 = (Expr *)pEVar11[1].super_Node.super_ArenaObj._vptr_ArenaObj)
  {
    if ((pEVar11->super_Node)._op != TO_PAREN) goto LAB_001553e8;
  }
  pEVar11 = (Expr *)0x0;
LAB_001553e8:
  lVar9._0_4_ = local_68[1].super_Node._coordinates.lineStart;
  lVar9._4_4_ = local_68[1].super_Node._coordinates.columnStart;
  for (; lVar9 != 0; lVar9 = *(long *)(lVar9 + 0x20)) {
    if (*(int *)(lVar9 + 0x18) != 0x37) goto LAB_0015552b;
  }
  lVar9 = 0;
LAB_0015552b:
  if (*(int *)(lVar9 + 0x18) != 0x39) {
    return;
  }
  nf = 2;
  switch(*(undefined4 *)(lVar9 + 0x1c)) {
  case 0:
    break;
  case 1:
    if (*(long *)(lVar9 + 0x20) == 0) goto switchD_00155551_default;
    break;
  case 2:
    if ((*(float *)(lVar9 + 0x20) == 0.0) && (!NAN(*(float *)(lVar9 + 0x20))))
    goto switchD_00155551_default;
    break;
  case 3:
    bVar18 = false;
    pf = 0;
    if (*(char *)(lVar9 + 0x20) == '\x01') break;
    goto LAB_001555c6;
  default:
switchD_00155551_default:
    bVar18 = false;
    pf = 0;
    goto LAB_001555c6;
  }
  pf = 2;
  bVar18 = true;
  nf = 0;
LAB_001555c6:
  pIVar10 = extractReceiver(pEVar11);
  if (pIVar10 != (Id *)0x0) {
    if (thenScope != (VarScope *)0x0 && !bVar18) {
      this->currentScope = thenScope;
      setValueFlags(this,&pIVar10->super_Expr,pf,nf);
    }
    if (bVar18 && pVVar17 != (VarScope *)0x0) {
      this->currentScope = pVVar17;
LAB_0015542a:
      setValueFlags(this,&pIVar10->super_Expr,nf,pf);
    }
LAB_0015542f:
    this->currentScope = pVVar12;
  }
  return;
}

Assistant:

void CheckerVisitor::speculateIfConditionHeuristics(const Expr *cond, VarScope *thenScope, VarScope *elseScope, std::unordered_set<const Expr *> &visited, int32_t evalId, unsigned flags, bool inv) {
  cond = deparen(cond);

  if (visited.find(cond) != visited.end()) {
    return;
  }

  visited.emplace(cond);

  enum TreeOp op = cond->op();

  VarScope *thisScope = currentScope;

  if (op == TO_NOT) {
    const UnExpr *u = static_cast<const UnExpr *>(cond);
    return speculateIfConditionHeuristics(u->argument(), thenScope, elseScope, visited, evalId, flags, !inv);
  }

  bool invertLR = false;
  if (op == TO_NE) {
    op = TO_EQ;
    inv = !inv;
  } else if (op == TO_OROR) {
    // apply a || b <==> !(!a && !b)
    op = TO_ANDAND;
    invertLR = true;
    inv = !inv;
  }

  if (inv) {
    std::swap(thenScope, elseScope);
  }

  const Expr *nullcCheckee = nullptr;
  if (detectNullCPattern(op, cond, nullcCheckee)) {
    // (o?.f ?? D) == V -- assume else-branch implies `o` non-null
    // (o?.f ?? D) > V -- then-b implies `o` non-null
    // (o?.f ?? D) < V -- then-b implies `o` non-null

    if (op == TO_LE || op == TO_GE) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    } else if (op == TO_EQ) {
      if (elseScope) {
        currentScope = elseScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }
    else {
      assert(op == TO_LT || op == TO_GT);
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(nullcCheckee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_NULLC) {
    // o?.f ?? false
    // o?.f ?? true
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    if (rhs->op() != TO_LITERAL) { // -V522
      return;
    }

    const LiteralExpr *lit = rhs->asLiteral();
    bool nullCond;
    switch (lit->kind())
    {
    case LK_BOOL:
      nullCond = rhs->asLiteral()->b();
      break;
    case LK_NULL:
      nullCond = false;
      break;
    case LK_INT:
      nullCond = lit->i() != 0;
      break;
    case LK_FLOAT:
      nullCond = lit->f() != 0.0f;
      break;
    case LK_STRING:
      nullCond = true;
      break;
    default:
      assert(0 && "unknown literal kind");
      break;
    }

    unsigned pf, nf;

    if (nullCond) {
      pf = RT_NULL;
      nf = 0;
    }
    else {
      pf = 0;
      nf = RT_NULL;
    }

    const Expr *receiver = extractReceiver(lhs);

    if (!receiver)
      return;

    if (thenScope && !nullCond) {
      currentScope = thenScope;
      setValueFlags(receiver, pf, nf);
    }

    if (elseScope && nullCond) {
      currentScope = elseScope;
      setValueFlags(receiver, nf, pf); // -V764
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (evalId == -1 && op == TO_CALL && thenScope) {
    // if condition looks like `if (foo(x)) x.bar()` consider call as null check
    currentScope = thenScope;
    const CallExpr *call = cond->asCallExpr();
    for (auto parg : call->arguments()) {
      auto arg = deparen(parg);
      if (arg->op() == TO_ID) { // -V522
        setValueFlags(arg, 0, RT_NULL);
      }
    }

    const Expr *callee = extractReceiver(call->callee());
    if (callee) {
      setValueFlags(callee, 0, RT_NULL);
    }

    currentScope = thisScope; // -V519
    return;
  }

  if (op == TO_ID) {
    int32_t evalIndex = -1;
    const Expr *eval = maybeEval(cond, evalIndex);

    bool notOverriden = evalId == -1 || evalIndex < evalId;

    if (thenScope && notOverriden) {
      // set iff it was explicit check like `if (o) { .. }`
      // otherwise there could be complexities, see intersected_assignment.nut
      currentScope = thenScope;
      setValueFlags(cond, 0, RT_NULL);
      currentScope = thisScope;
    }

    if (elseScope && notOverriden && (flags & NULL_CHECK_F)) {
      // set NULL iff it was explicit null check `if (o == null) { ... }` otherwise it could not be null, see w233_inc_in_for.nut
      currentScope = elseScope;
      setValueFlags(cond, RT_NULL, 0);
      currentScope = thisScope;
    }

    if (eval != cond) {
      // let cond = x != null
      // if (cond) { ... }
      speculateIfConditionHeuristics(eval, thenScope, elseScope, visited, evalIndex, flags, false);
    }
    return;
  }

  if (op == TO_GETSLOT || op == TO_GETFIELD) {
    // x?[y]
    const AccessExpr *acc = static_cast<const AccessExpr *>(cond);
    const Expr *reciever = extractReceiver(deparen(acc->receiver()));

    if (reciever && thenScope) {
      currentScope = thenScope;
      setValueFlags(reciever, 0, RT_NULL);
    }

    if (op == TO_GETSLOT) {
      const Expr *key = deparen(acc->asGetSlot()->key());
      if (thenScope) {
        currentScope = thenScope;
        setValueFlags(key, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_EQ) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const LiteralExpr *lhs_lit = lhs->op() == TO_LITERAL ? lhs->asLiteral() : nullptr; // -V522
    const LiteralExpr *rhs_lit = rhs->op() == TO_LITERAL ? rhs->asLiteral() : nullptr; // -V522

    const LiteralExpr *lit = lhs_lit ? lhs_lit : rhs_lit;
    const Expr *testee = lit == lhs ? rhs : lhs;

    if (!lit)
      return;

    if (lit->kind() == LK_NULL) {
      speculateIfConditionHeuristics(testee, elseScope, thenScope, visited, evalId, flags | NULL_CHECK_F, false);
      return;
    }

    const Expr *receiver = extractReceiver(testee);

    if (receiver && thenScope) {
      currentScope = thenScope;
      setValueFlags(receiver, 0, RT_NULL);
      currentScope = thisScope;
    }

  }

  if (isRelationOperator(op)) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = deparen(bin->lhs());
    const Expr *rhs = deparen(bin->rhs());

    const Id *lhs_id = lhs->op() == TO_ID ? lhs->asId() : nullptr; // -V522
    const Id *rhs_id = rhs->op() == TO_ID ? rhs->asId() : nullptr; // -V522

    if (thenScope) {
      currentScope = thenScope;
      if (lhs_id) {
        setValueFlags(lhs_id, 0, RT_NULL);
      }
      if (rhs_id) {
        setValueFlags(rhs_id, 0, RT_NULL);
      }
      currentScope = thisScope;
    }
    return;
  }

  const LiteralExpr *typeLit = nullptr;
  const Expr *typeCheckee = nullptr;

  if (detectTypeOfPattern(cond, typeCheckee, typeLit)) {
    assert(typeCheckee && typeLit);

    const Id *checkeeId = extractReceiver(typeCheckee);
    if (!checkeeId)
      return;

    bool nullCheck = strcmp(typeLit->s(), _SC("null")) == 0; // todo: should it be more precise in case of avaliable names
    bool accessCheck = typeCheckee != checkeeId;

    // if it's null check we could know for sure that true-branch implies NULL and false-branch implies NON_NULL
    // if it's not a null check we could only guarantee that true-branch implies NON_NULL
    unsigned pt = 0, nt = 0, pe = 0, ne = 0;

    if (nullCheck) {
      if (accessCheck) {
        ne = RT_NULL;
      }
      else {
        pt = RT_NULL;
        ne = RT_NULL;
      }
    }
    else {
      nt = RT_NULL;
    }

    if (thenScope) {
      currentScope = thenScope;
      setValueFlags(checkeeId, pt, nt);
    }
    if (elseScope) {
      currentScope = elseScope;
      setValueFlags(checkeeId, pe, ne);
    }

    currentScope = thisScope; // -V519

    return;
  }

  if (op == TO_ANDAND) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    VarScope *lhsEScope = nullptr;
    VarScope *rhsEScope = nullptr;

    // In '&&' operator all effects of the left-hand side work for the right side as well
    if (elseScope) {
      lhsEScope = elseScope->copy(arena);
      rhsEScope = elseScope->copy(arena);
    }

    speculateIfConditionHeuristics(lhs, thenScope, lhsEScope, visited, evalId, flags, invertLR);
    speculateIfConditionHeuristics(rhs, thenScope, rhsEScope, visited, evalId, flags, invertLR);

    if (elseScope) {
      // In contrast in `false`-branch there is no such integral effect, all we could say is something common of both side so
      // to compute that `common` part intersect lhs with rhs
      lhsEScope->intersectScopes(rhsEScope); // -V522
      elseScope->copyFrom(lhsEScope);

      lhsEScope->~VarScope();
      rhsEScope->~VarScope();
    }

    return;
  }

  if (op == TO_INSTANCEOF || op == TO_IN) {
    const BinExpr *bin = cond->asBinExpr();
    const Expr *lhs = bin->lhs();
    const Expr *rhs = bin->rhs();

    const Expr *checkee = extractReceiver(lhs);

    if (checkee && thenScope) {
      currentScope = thenScope;
      setValueFlags(checkee, 0, RT_NULL);
    }

    if (op == TO_IN) {
      checkee = extractReceiver(rhs);
      if (checkee && thenScope) {
        currentScope = thenScope;
        setValueFlags(checkee, 0, RT_NULL);
      }
    }

    currentScope = thisScope; // -V519

    return;
  }
}